

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_compression_store.c
# Opt level: O0

void test_write_format_zip_compression_store(void)

{
  undefined1 *puVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  archive_entry *a_00;
  archive_entry *paVar5;
  char *file;
  void *extra;
  unsigned_long c;
  char *e2;
  undefined1 *_v2;
  undefined1 *_v1;
  size_t sVar6;
  char *pcVar7;
  char *file_00;
  size_t l;
  char *ld;
  unsigned_long crc;
  tm *tm;
  time_t t;
  short folder_gid;
  short folder_uid;
  int folder_perm;
  char folder_name [8];
  short file_gid;
  short file_uid;
  int file_perm;
  char file_data2 [5];
  char file_data1 [5];
  char file_name [5];
  size_t used;
  char *extra_start;
  char *local_header;
  char *q;
  char *p;
  char *buffend;
  char buff [100000];
  archive_entry *entry;
  archive *a;
  void *in_stack_fffffffffffe7768;
  archive_entry *paVar8;
  void *pvVar9;
  archive_entry *in_stack_fffffffffffe7770;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  archive *in_stack_fffffffffffe7778;
  longlong lVar13;
  undefined4 in_stack_fffffffffffe7780;
  wchar_t in_stack_fffffffffffe7784;
  archive *in_stack_fffffffffffe7788;
  void *in_stack_fffffffffffe77a0;
  char *in_stack_fffffffffffe77b0;
  void *in_stack_fffffffffffe77b8;
  char *in_stack_fffffffffffe77c0;
  void *in_stack_fffffffffffe77c8;
  undefined8 in_stack_fffffffffffe77d0;
  wchar_t wVar14;
  char *in_stack_fffffffffffe77d8;
  size_t in_stack_fffffffffffe77f0;
  char *in_stack_fffffffffffe77f8;
  void *in_stack_fffffffffffe7800;
  time_t tStack_18718;
  short sStack_18710;
  short sStack_1870e;
  uint uStack_1870c;
  char acStack_18708 [8];
  short sStack_18700;
  short sStack_186fe;
  undefined4 uStack_186fc;
  undefined4 uStack_186f7;
  undefined1 uStack_186f3;
  undefined4 uStack_186f2;
  undefined1 uStack_186ee;
  char acStack_186ed [5];
  long lStack_186e8;
  char *pcStack_186e0;
  char *pcStack_186d8;
  undefined8 uStack_186d0;
  char *pcStack_186c8;
  undefined1 *puStack_186c0;
  undefined1 auStack_186b8 [100024];
  
  wVar14 = (wchar_t)((ulong)in_stack_fffffffffffe77d0 >> 0x20);
  builtin_strncpy(acStack_186ed,"file",5);
  uStack_186f2 = 0x34333231;
  uStack_186ee = 0x35;
  uStack_186f7 = 0x39383736;
  uStack_186f3 = 0x30;
  uStack_186fc = 0x1a4;
  sStack_186fe = 10;
  sStack_18700 = 0x14;
  builtin_strncpy(acStack_18708,"folder/",8);
  uStack_1870c = 0x1ed;
  sStack_1870e = 0x1e;
  sStack_18710 = 0x28;
  tStack_18718 = time((time_t *)0x0);
  localtime(&tStack_18718);
  a_00 = (archive_entry *)archive_write_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffe7784,in_stack_fffffffffffe7780),
                   (wchar_t)((ulong)in_stack_fffffffffffe7778 >> 0x20),
                   (wchar_t)in_stack_fffffffffffe7778,(char *)in_stack_fffffffffffe7770,
                   in_stack_fffffffffffe7768);
  archive_write_set_format_zip(in_stack_fffffffffffe7778);
  paVar8 = a_00;
  assertion_equal_int((char *)in_stack_fffffffffffe7788,in_stack_fffffffffffe7784,
                      (longlong)in_stack_fffffffffffe7778,(char *)in_stack_fffffffffffe7770,
                      (longlong)a_00,(char *)0x2178fd,in_stack_fffffffffffe77a0);
  archive_write_set_options((archive *)in_stack_fffffffffffe7770,(char *)paVar8);
  paVar8 = a_00;
  assertion_equal_int((char *)in_stack_fffffffffffe7788,in_stack_fffffffffffe7784,
                      (longlong)in_stack_fffffffffffe7778,(char *)in_stack_fffffffffffe7770,
                      (longlong)a_00,(char *)0x217943,in_stack_fffffffffffe77a0);
  archive_write_set_options((archive *)in_stack_fffffffffffe7770,(char *)paVar8);
  assertion_equal_int((char *)in_stack_fffffffffffe7788,in_stack_fffffffffffe7784,
                      (longlong)in_stack_fffffffffffe7778,(char *)in_stack_fffffffffffe7770,
                      (longlong)a_00,(char *)0x217989,in_stack_fffffffffffe77a0);
  archive_write_add_filter_none((archive *)a_00);
  assertion_equal_int((char *)in_stack_fffffffffffe7788,in_stack_fffffffffffe7784,
                      (longlong)in_stack_fffffffffffe7778,(char *)in_stack_fffffffffffe7770,
                      (longlong)a_00,(char *)0x2179c8,in_stack_fffffffffffe77a0);
  archive_write_set_bytes_per_block
            (in_stack_fffffffffffe7778,(int)((ulong)in_stack_fffffffffffe7770 >> 0x20));
  assertion_equal_int((char *)in_stack_fffffffffffe7788,in_stack_fffffffffffe7784,
                      (longlong)in_stack_fffffffffffe7778,(char *)in_stack_fffffffffffe7770,
                      (longlong)a_00,(char *)0x217a0c,in_stack_fffffffffffe77a0);
  archive_write_set_bytes_in_last_block
            (in_stack_fffffffffffe7778,(int)((ulong)in_stack_fffffffffffe7770 >> 0x20));
  assertion_equal_int((char *)in_stack_fffffffffffe7788,in_stack_fffffffffffe7784,
                      (longlong)in_stack_fffffffffffe7778,(char *)in_stack_fffffffffffe7770,
                      (longlong)a_00,(char *)0x217a50,in_stack_fffffffffffe77a0);
  archive_write_open_memory
            (in_stack_fffffffffffe7788,
             (void *)CONCAT44(in_stack_fffffffffffe7784,in_stack_fffffffffffe7780),
             (size_t)in_stack_fffffffffffe7778,(size_t *)in_stack_fffffffffffe7770);
  paVar8 = a_00;
  assertion_equal_int((char *)in_stack_fffffffffffe7788,in_stack_fffffffffffe7784,
                      (longlong)in_stack_fffffffffffe7778,(char *)in_stack_fffffffffffe7770,
                      (longlong)a_00,(char *)0x217aa4,in_stack_fffffffffffe77a0);
  paVar5 = archive_entry_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffe7784,in_stack_fffffffffffe7780),
                   (wchar_t)((ulong)in_stack_fffffffffffe7778 >> 0x20),
                   (wchar_t)in_stack_fffffffffffe7778,(char *)in_stack_fffffffffffe7770,paVar8);
  archive_entry_set_pathname(in_stack_fffffffffffe7770,(char *)paVar8);
  archive_entry_set_mode(paVar5,0x81a4);
  archive_entry_set_size(paVar5,10);
  archive_entry_set_uid(paVar5,(long)sStack_186fe);
  archive_entry_set_gid(paVar5,(long)sStack_18700);
  archive_entry_set_mtime(paVar5,tStack_18718,0);
  archive_entry_set_atime(paVar5,tStack_18718 + 3,0);
  archive_write_header((archive *)in_stack_fffffffffffe7770,paVar8);
  paVar8 = a_00;
  assertion_equal_int((char *)in_stack_fffffffffffe7788,in_stack_fffffffffffe7784,
                      (longlong)in_stack_fffffffffffe7778,(char *)in_stack_fffffffffffe7770,
                      (longlong)a_00,(char *)0x217bbc,in_stack_fffffffffffe77a0);
  archive_write_data((archive *)in_stack_fffffffffffe7770,paVar8,0x217bd6);
  paVar8 = a_00;
  assertion_equal_int((char *)in_stack_fffffffffffe7788,in_stack_fffffffffffe7784,
                      (longlong)in_stack_fffffffffffe7778,(char *)in_stack_fffffffffffe7770,
                      (longlong)a_00,(char *)0x217c09,in_stack_fffffffffffe77a0);
  archive_write_data((archive *)in_stack_fffffffffffe7770,paVar8,0x217c23);
  paVar8 = a_00;
  assertion_equal_int((char *)in_stack_fffffffffffe7788,in_stack_fffffffffffe7784,
                      (longlong)in_stack_fffffffffffe7778,(char *)in_stack_fffffffffffe7770,
                      (longlong)a_00,(char *)0x217c56,in_stack_fffffffffffe77a0);
  archive_entry_free((archive_entry *)0x217c63);
  paVar5 = archive_entry_new();
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffe7784,in_stack_fffffffffffe7780),
                   (wchar_t)((ulong)in_stack_fffffffffffe7778 >> 0x20),
                   (wchar_t)in_stack_fffffffffffe7778,(char *)in_stack_fffffffffffe7770,paVar8);
  archive_entry_set_pathname(in_stack_fffffffffffe7770,(char *)paVar8);
  archive_entry_set_mode(paVar5,uStack_1870c | 0x4000);
  archive_entry_set_size(paVar5,0);
  archive_entry_set_uid(paVar5,(long)sStack_1870e);
  archive_entry_set_gid(paVar5,(long)sStack_18710);
  archive_entry_set_mtime(paVar5,tStack_18718,0);
  archive_entry_set_ctime(paVar5,tStack_18718 + 5,0);
  archive_write_header((archive *)in_stack_fffffffffffe7770,paVar8);
  assertion_equal_int((char *)in_stack_fffffffffffe7788,in_stack_fffffffffffe7784,
                      (longlong)in_stack_fffffffffffe7778,(char *)in_stack_fffffffffffe7770,
                      (longlong)a_00,(char *)0x217d82,in_stack_fffffffffffe77a0);
  archive_entry_free((archive_entry *)0x217d8f);
  archive_write_close((archive *)0x217d9c);
  assertion_equal_int((char *)in_stack_fffffffffffe7788,in_stack_fffffffffffe7784,
                      (longlong)in_stack_fffffffffffe7778,(char *)in_stack_fffffffffffe7770,
                      (longlong)a_00,(char *)0x217dce,in_stack_fffffffffffe77a0);
  archive_write_free((archive *)0x217ddb);
  assertion_equal_int((char *)in_stack_fffffffffffe7788,in_stack_fffffffffffe7784,
                      (longlong)in_stack_fffffffffffe7778,(char *)in_stack_fffffffffffe7770,0,
                      (char *)0x217e09,in_stack_fffffffffffe77a0);
  dumpfile((char *)CONCAT44(in_stack_fffffffffffe7784,in_stack_fffffffffffe7780),
           in_stack_fffffffffffe7778,(size_t)in_stack_fffffffffffe7770);
  puStack_186c0 = auStack_186b8 + lStack_186e8;
  pcStack_186c8 = (char *)((long)&uStack_186d0 + lStack_186e8 + 2);
  failure("End-of-central-directory begins with PK\\005\\006 signature");
  pcVar10 = "4";
  lVar13 = 0;
  assertion_equal_mem(in_stack_fffffffffffe77d8,wVar14,in_stack_fffffffffffe77c8,
                      in_stack_fffffffffffe77c0,in_stack_fffffffffffe77b8,in_stack_fffffffffffe77b0,
                      in_stack_fffffffffffe77f0,in_stack_fffffffffffe77f8,in_stack_fffffffffffe7800)
  ;
  failure("This must be disk 0");
  i2((char *)((long)pcStack_186c8 + 4));
  assertion_equal_int((char *)in_stack_fffffffffffe7788,in_stack_fffffffffffe7784,lVar13,pcVar10,0,
                      (char *)0x217efb,in_stack_fffffffffffe77a0);
  failure("Central dir must start on disk 0");
  i2((char *)((long)pcStack_186c8 + 6));
  assertion_equal_int((char *)in_stack_fffffffffffe7788,in_stack_fffffffffffe7784,lVar13,pcVar10,0,
                      (char *)0x217f49,in_stack_fffffffffffe77a0);
  failure("All central dir entries are on this disk");
  iVar2 = i2((char *)((long)pcStack_186c8 + 8));
  file = (char *)(long)iVar2;
  i2((char *)((long)pcStack_186c8 + 10));
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar10,0,(char *)0x217fb1,
                      in_stack_fffffffffffe77a0);
  uVar3 = i4(pcVar10);
  uVar4 = i4(pcVar10);
  failure("CD start (%d) + CD length (%d) should == archive size - 22",(ulong)uVar3,(ulong)uVar4);
  i4(pcVar10);
  i4(pcVar10);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar10,0,(char *)0x218051,
                      in_stack_fffffffffffe77a0);
  failure("no zip comment");
  i2((char *)((long)pcStack_186c8 + 0x14));
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar10,0,(char *)0x21809f,
                      in_stack_fffffffffffe77a0);
  iVar2 = i4(pcVar10);
  pcStack_186c8 = auStack_186b8 + iVar2;
  uVar3 = i4(pcVar10);
  failure("Central file record at offset %d should begin with PK\\001\\002 signature",(ulong)uVar3);
  pcVar10 = "4";
  lVar13 = 0;
  assertion_equal_mem(in_stack_fffffffffffe77d8,wVar14,in_stack_fffffffffffe77c8,
                      in_stack_fffffffffffe77c0,in_stack_fffffffffffe77b8,in_stack_fffffffffffe77b0,
                      in_stack_fffffffffffe77f0,in_stack_fffffffffffe77f8,in_stack_fffffffffffe7800)
  ;
  i2(pcStack_186c8 + 4);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar10,0,(char *)0x218184,
                      in_stack_fffffffffffe77a0);
  i2(pcStack_186c8 + 6);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar10,0,(char *)0x2181c7,
                      in_stack_fffffffffffe77a0);
  i2(pcStack_186c8 + 8);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar10,0,(char *)0x21820a,
                      in_stack_fffffffffffe77a0);
  i2(pcStack_186c8 + 10);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar10,0,(char *)0x21824a,
                      in_stack_fffffffffffe77a0);
  iVar2 = i2(pcStack_186c8 + 0xc);
  extra = (void *)(long)iVar2;
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar10,0,(char *)0x2182cf,extra);
  i2(pcStack_186c8 + 0xe);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar10,0,(char *)0x21833e,extra);
  c = bitcrc32(0,&uStack_186f2,5);
  bitcrc32(c,&uStack_186f7,5);
  i4(pcVar10);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar10,0,(char *)0x2183c3,extra);
  i4(pcVar10);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar10,0,(char *)0x218406,extra);
  i4(pcVar10);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar10,0,(char *)0x218449,extra);
  iVar2 = i2(pcStack_186c8 + 0x1c);
  e2 = (char *)(long)iVar2;
  strlen(acStack_186ed);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar10,0,(char *)0x21849f,extra);
  i2(pcStack_186c8 + 0x1e);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar10,0,(char *)0x2184e2,extra);
  i2(pcStack_186c8 + 0x20);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar10,0,(char *)0x218522,extra);
  i2(pcStack_186c8 + 0x22);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar10,0,(char *)0x218562,extra);
  i2(pcStack_186c8 + 0x24);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar10,0,(char *)0x2185a2,extra);
  i4(pcVar10);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar10,0,(char *)0x2185ef,extra);
  i4(pcVar10);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar10,0,(char *)0x21862f,extra);
  _v2 = pcStack_186c8 + 0x2e;
  pcVar10 = acStack_186ed;
  strlen(acStack_186ed);
  pcVar11 = "strlen(file_name)";
  lVar13 = 0;
  assertion_equal_mem(in_stack_fffffffffffe77d8,wVar14,in_stack_fffffffffffe77c8,pcVar10,_v2,e2,
                      in_stack_fffffffffffe77f0,in_stack_fffffffffffe77f8,in_stack_fffffffffffe7800)
  ;
  _v1 = pcStack_186c8 + 0x2e;
  sVar6 = strlen(acStack_186ed);
  pcStack_186c8 = _v1 + sVar6;
  i2(pcStack_186c8);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x218712,extra);
  i2(pcStack_186c8 + 2);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x218755,extra);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x218791,extra);
  i4(pcVar11);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x2187d6,extra);
  i4(pcVar11);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x21881f,extra);
  pcVar7 = pcStack_186c8 + 4;
  iVar2 = i2(pcStack_186c8 + 2);
  pcStack_186c8 = pcVar7 + iVar2;
  i2(pcStack_186c8);
  wVar14 = (wchar_t)((ulong)pcVar7 >> 0x20);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x218895,extra);
  i2(pcStack_186c8 + 2);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x2188d8,extra);
  file_00 = pcStack_186c8 + 4;
  iVar2 = i2(pcStack_186c8 + 2);
  pcStack_186c8 = file_00 + iVar2;
  pcStack_186d8 = auStack_186b8;
  pcVar7 = "4";
  lVar13 = 0;
  uStack_186d0 = pcStack_186d8;
  assertion_equal_mem(file_00,wVar14,_v1,pcVar10,_v2,e2,in_stack_fffffffffffe77f0,
                      in_stack_fffffffffffe77f8,in_stack_fffffffffffe7800);
  i2(uStack_186d0 + 4);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar7,0,(char *)0x2189b8,extra);
  i2(uStack_186d0 + 6);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar7,0,(char *)0x2189fb,extra);
  i2(uStack_186d0 + 8);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar7,0,(char *)0x218a3b,extra);
  i2(uStack_186d0 + 10);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar7,0,(char *)0x218ac6,extra);
  i2(uStack_186d0 + 0xc);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar7,0,(char *)0x218b35,extra);
  i4(pcVar7);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar7,0,(char *)0x218b75,extra);
  i4(pcVar7);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar7,0,(char *)0x218bb8,extra);
  i4(pcVar7);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar7,0,(char *)0x218bfb,extra);
  iVar2 = i2(uStack_186d0 + 0x1a);
  l = (size_t)iVar2;
  strlen(acStack_186ed);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar7,0,(char *)0x218c57,extra);
  i2(uStack_186d0 + 0x1c);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar7,0,(char *)0x218c9a,extra);
  ld = uStack_186d0 + 0x1e;
  pcVar7 = acStack_186ed;
  strlen(acStack_186ed);
  pcVar12 = "strlen(file_name)";
  lVar13 = 0;
  assertion_equal_mem(file_00,wVar14,_v1,pcVar10,_v2,e2,l,ld,pcVar7);
  puVar1 = uStack_186d0;
  sVar6 = strlen(acStack_186ed);
  pcStack_186e0 = puVar1 + sVar6 + 0x1e;
  uStack_186d0 = pcStack_186e0;
  i2(pcStack_186e0);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x218d97,extra);
  i2(uStack_186d0 + 2);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x218dda,extra);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x218e16,extra);
  i4(pcVar12);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x218e5b,extra);
  i4(pcVar12);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x218ea4,extra);
  pcVar11 = uStack_186d0;
  iVar2 = i2(uStack_186d0 + 2);
  uStack_186d0 = pcVar11 + (long)iVar2 + 4;
  i2(uStack_186d0);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x218f20,extra);
  i2(uStack_186d0 + 2);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x218f63,extra);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x218f9f,extra);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x218fdb,extra);
  i4(pcVar12);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x219021,extra);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x21905d,extra);
  i4(pcVar12);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x2190a3,extra);
  pcVar11 = uStack_186d0;
  iVar2 = i2(uStack_186d0 + 2);
  uStack_186d0 = pcVar11 + (long)iVar2 + 4;
  i2(uStack_186d0);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x21911f,extra);
  i2(uStack_186d0 + 2);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x219162,extra);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x21919e,extra);
  i2(uStack_186d0 + 5);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x2191e4,extra);
  i2(uStack_186d0 + 7);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x219224,extra);
  i4(pcVar12);
  pvVar9 = (void *)0x0;
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x219271,extra);
  pcVar11 = uStack_186d0;
  iVar2 = i2(uStack_186d0 + 2);
  uStack_186d0 = pcVar11 + (long)iVar2 + 4;
  i2(pcStack_186d8 + 0x1c);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffe7784,in_stack_fffffffffffe7780),
                   (wchar_t)((ulong)lVar13 >> 0x20),(wchar_t)lVar13,pcVar12,pvVar9);
  pcVar11 = pcStack_186e0;
  iVar2 = i2(pcStack_186d8 + 0x1c);
  uStack_186d0 = pcVar11 + iVar2;
  assertion_equal_mem(file_00,wVar14,_v1,pcVar10,_v2,e2,l,ld,pcVar7);
  assertion_equal_mem(file_00,wVar14,_v1,pcVar10,_v2,e2,l,ld,pcVar7);
  uStack_186d0 = uStack_186d0 + 10;
  pcVar11 = "4";
  lVar13 = 0;
  assertion_equal_mem(file_00,wVar14,_v1,pcVar10,_v2,e2,l,ld,pcVar7);
  i4(pcVar11);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x2194a5,extra);
  i4(pcVar11);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x2194e8,extra);
  i4(pcVar11);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x21952b,extra);
  uStack_186d0 = uStack_186d0 + 0x10;
  pcVar11 = "4";
  lVar13 = 0;
  assertion_equal_mem(file_00,wVar14,_v1,pcVar10,_v2,e2,l,ld,pcVar7);
  i2(pcStack_186c8 + 4);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x2195d0,extra);
  i2(pcStack_186c8 + 6);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x219613,extra);
  i2(pcStack_186c8 + 8);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x219653,extra);
  i2(pcStack_186c8 + 10);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x219693,extra);
  i2(pcStack_186c8 + 0xc);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x219724,extra);
  i2(pcStack_186c8 + 0xe);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x219793,extra);
  i4(pcVar11);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x2197e4,extra);
  i4(pcVar11);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x219824,extra);
  i4(pcVar11);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x219864,extra);
  i2(pcStack_186c8 + 0x1c);
  strlen(acStack_18708);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x2198c0,extra);
  i2(pcStack_186c8 + 0x1e);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x219903,extra);
  i2(pcStack_186c8 + 0x20);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x219943,extra);
  i2(pcStack_186c8 + 0x22);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x219983,extra);
  i2(pcStack_186c8 + 0x24);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x2199c3,extra);
  i4(pcVar11);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x219a10,extra);
  i4(pcVar11);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x219a60,extra);
  strlen(acStack_18708);
  pcVar12 = "strlen(folder_name)";
  lVar13 = 0;
  assertion_equal_mem(file_00,wVar14,_v1,pcVar10,_v2,e2,l,ld,pcVar7);
  pcVar11 = pcStack_186c8;
  sVar6 = strlen(acStack_18708);
  pcStack_186c8 = pcVar11 + sVar6 + 0x2e;
  i2(pcStack_186c8);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x219b55,extra);
  i2(pcStack_186c8 + 2);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x219b98,extra);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x219bd4,extra);
  i4(pcVar12);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x219c19,extra);
  i4(pcVar12);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x219c62,extra);
  pcVar11 = pcStack_186c8;
  iVar2 = i2(pcStack_186c8 + 2);
  pcStack_186c8 = pcVar11 + (long)iVar2 + 4;
  i2(pcStack_186c8);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x219cde,extra);
  i2(pcStack_186c8 + 2);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x219d21,extra);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x219d5d,extra);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x219d99,extra);
  i4(pcVar12);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x219ddf,extra);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x219e1b,extra);
  i4(pcVar12);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x219e61,extra);
  pcStack_186d8 = uStack_186d0;
  pcVar11 = "4";
  lVar13 = 0;
  assertion_equal_mem(file_00,wVar14,_v1,pcVar10,_v2,e2,l,ld,pcVar7);
  i2(uStack_186d0 + 4);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x219f02,extra);
  i2(uStack_186d0 + 6);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x219f42,extra);
  i2(uStack_186d0 + 8);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x219f82,extra);
  i2(uStack_186d0 + 10);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x21a013,extra);
  i2(uStack_186d0 + 0xc);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x21a082,extra);
  i4(pcVar11);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x21a0c2,extra);
  i4(pcVar11);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x21a102,extra);
  i4(pcVar11);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x21a142,extra);
  i2(uStack_186d0 + 0x1a);
  strlen(acStack_18708);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x21a19e,extra);
  i2(uStack_186d0 + 0x1c);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar11,0,(char *)0x21a1e1,extra);
  strlen(acStack_18708);
  pcVar12 = "strlen(folder_name)";
  lVar13 = 0;
  assertion_equal_mem(file_00,wVar14,_v1,pcVar10,_v2,e2,l,ld,pcVar7);
  pcVar11 = uStack_186d0;
  sVar6 = strlen(acStack_18708);
  pcStack_186e0 = pcVar11 + sVar6 + 0x1e;
  uStack_186d0 = pcStack_186e0;
  i2(pcStack_186e0);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x21a2de,extra);
  i2(uStack_186d0 + 2);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x21a321,extra);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x21a35d,extra);
  i4(pcVar12);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x21a3a2,extra);
  i4(pcVar12);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x21a3eb,extra);
  pcVar11 = uStack_186d0;
  iVar2 = i2(uStack_186d0 + 2);
  uStack_186d0 = pcVar11 + (long)iVar2 + 4;
  i2(uStack_186d0);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x21a467,extra);
  i2(uStack_186d0 + 2);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x21a4aa,extra);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x21a4e6,extra);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x21a522,extra);
  i4(pcVar12);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x21a568,extra);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x21a5a4,extra);
  i4(pcVar12);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x21a5ea,extra);
  pcVar11 = uStack_186d0;
  iVar2 = i2(uStack_186d0 + 2);
  uStack_186d0 = pcVar11 + (long)iVar2 + 4;
  i2(uStack_186d0);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x21a666,extra);
  i2(uStack_186d0 + 2);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x21a6a9,extra);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x21a6e5,extra);
  i2(uStack_186d0 + 5);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x21a72b,extra);
  i2(uStack_186d0 + 7);
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x21a76b,extra);
  i4(pcVar12);
  pvVar9 = (void *)0x0;
  assertion_equal_int(file,in_stack_fffffffffffe7784,lVar13,pcVar12,0,(char *)0x21a7b8,extra);
  pcVar11 = uStack_186d0;
  iVar2 = i2(uStack_186d0 + 2);
  uStack_186d0 = pcVar11 + (long)iVar2 + 4;
  i2(pcStack_186d8 + 0x1c);
  assertion_assert((char *)CONCAT44(in_stack_fffffffffffe7784,in_stack_fffffffffffe7780),
                   (wchar_t)((ulong)lVar13 >> 0x20),(wchar_t)lVar13,pcVar12,pvVar9);
  pcVar11 = pcStack_186e0;
  iVar2 = i2(pcStack_186d8 + 0x1c);
  uStack_186d0 = pcVar11 + iVar2;
  assertion_equal_mem(file_00,wVar14,_v1,pcVar10,_v2,e2,l,ld,pcVar7);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_zip_compression_store)
{
	/* Buffer data */
	struct archive *a;
	struct archive_entry *entry;
	char buff[100000];
	const char *buffend;
	/* p is the pointer to walk over the central directory,
	 * q walks over the local headers, the data and the data descriptors. */
	const char *p, *q, *local_header, *extra_start;
	size_t used;

	/* File data */
	char file_name[] = "file";
	char file_data1[] = {'1', '2', '3', '4', '5'};
	char file_data2[] = {'6', '7', '8', '9', '0'};
	int file_perm = 00644;
	short file_uid = 10;
	short file_gid = 20;

	/* Folder data */
	char folder_name[] = "folder/";
	int folder_perm = 00755;
	short folder_uid = 30;
	short folder_gid = 40;

	/* Time data */
	time_t t = time(NULL);
	struct tm *tm = localtime(&t);

	/* Misc variables */
	unsigned long crc;

	/* Create new ZIP archive in memory without padding. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_zip(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "zip:compression=store"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_options(a, "zip:experimental"));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_bytes_per_block(a, 1));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_bytes_in_last_block(a, 1));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, sizeof(buff), &used));

	/* Write entries. */

	/* Regular file */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_pathname(entry, file_name);
	archive_entry_set_mode(entry, S_IFREG | 0644);
	archive_entry_set_size(entry, sizeof(file_data1) + sizeof(file_data2));
	archive_entry_set_uid(entry, file_uid);
	archive_entry_set_gid(entry, file_gid);
	archive_entry_set_mtime(entry, t, 0);
	archive_entry_set_atime(entry, t + 3, 0);
	assertEqualIntA(a, 0, archive_write_header(a, entry));
	assertEqualIntA(a, sizeof(file_data1), archive_write_data(a, file_data1, sizeof(file_data1)));
	assertEqualIntA(a, sizeof(file_data2), archive_write_data(a, file_data2, sizeof(file_data2)));
	archive_entry_free(entry);

	/* Folder */
	assert((entry = archive_entry_new()) != NULL);
	archive_entry_set_pathname(entry, folder_name);
	archive_entry_set_mode(entry, S_IFDIR | folder_perm);
	archive_entry_set_size(entry, 0);
	archive_entry_set_uid(entry, folder_uid);
	archive_entry_set_gid(entry, folder_gid);
	archive_entry_set_mtime(entry, t, 0);
	archive_entry_set_ctime(entry, t + 5, 0);
	assertEqualIntA(a, 0, archive_write_header(a, entry));
	archive_entry_free(entry);

	/* Close the archive . */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	dumpfile("constructed.zip", buff, used);

	/* Remember the end of the archive in memory. */
	buffend = buff + used;

	/* Verify "End of Central Directory" record. */
	/* Get address of end-of-central-directory record. */
	p = buffend - 22; /* Assumes there is no zip comment field. */
	failure("End-of-central-directory begins with PK\\005\\006 signature");
	assertEqualMem(p, "PK\005\006", 4);
	failure("This must be disk 0");
	assertEqualInt(i2(p + 4), 0);
	failure("Central dir must start on disk 0");
	assertEqualInt(i2(p + 6), 0);
	failure("All central dir entries are on this disk");
	assertEqualInt(i2(p + 8), i2(p + 10));
	failure("CD start (%d) + CD length (%d) should == archive size - 22",
	    i4(p + 12), i4(p + 16));
	assertEqualInt(i4(p + 12) + i4(p + 16), used - 22);
	failure("no zip comment");
	assertEqualInt(i2(p + 20), 0);

	/* Get address of first entry in central directory. */
	p = buff + i4(buffend - 6);
	failure("Central file record at offset %d should begin with"
	    " PK\\001\\002 signature",
	    i4(buffend - 10));

	/* Verify file entry in central directory. */
	assertEqualMem(p, "PK\001\002", 4); /* Signature */
	assertEqualInt(i2(p + 4), 3 * 256 + 10); /* Version made by */
	assertEqualInt(i2(p + 6), 10); /* Version needed to extract */
	assertEqualInt(i2(p + 8), 8); /* Flags */
	assertEqualInt(i2(p + 10), 0); /* Compression method */
	assertEqualInt(i2(p + 12), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2(p + 14), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	crc = bitcrc32(0, file_data1, sizeof(file_data1));
	crc = bitcrc32(crc, file_data2, sizeof(file_data2));
	assertEqualInt(i4(p + 16), crc); /* CRC-32 */
	assertEqualInt(i4(p + 20), sizeof(file_data1) + sizeof(file_data2)); /* Compressed size */
	assertEqualInt(i4(p + 24), sizeof(file_data1) + sizeof(file_data2)); /* Uncompressed size */
	assertEqualInt(i2(p + 28), strlen(file_name)); /* Pathname length */
	assertEqualInt(i2(p + 30), 28); /* Extra field length */
	assertEqualInt(i2(p + 32), 0); /* File comment length */
	assertEqualInt(i2(p + 34), 0); /* Disk number start */
	assertEqualInt(i2(p + 36), 0); /* Internal file attrs */
	assertEqualInt(i4(p + 38) >> 16 & 01777, file_perm); /* External file attrs */
	assertEqualInt(i4(p + 42), 0); /* Offset of local header */
	assertEqualMem(p + 46, file_name, strlen(file_name)); /* Pathname */
	p = p + 46 + strlen(file_name);
	assertEqualInt(i2(p), 0x5455); /* 'UT' extension header */
	assertEqualInt(i2(p + 2), 9); /* 'UT' size */
	assertEqualInt(p[4], 3); /* 'UT' flags */
	assertEqualInt(i4(p + 5), t); /* 'UT' mtime */
	assertEqualInt(i4(p + 9), t + 3); /* 'UT' atime */
	p = p + 4 + i2(p + 2);
	assertEqualInt(i2(p), 0x7875); /* 'ux' extension header */
	assertEqualInt(i2(p + 2), 11); /* 'ux' size */
/* TODO */
	p = p + 4 + i2(p + 2);

	/* Verify local header of file entry. */
	local_header = q = buff;
	assertEqualMem(q, "PK\003\004", 4); /* Signature */
	assertEqualInt(i2(q + 4), 10); /* Version needed to extract */
	assertEqualInt(i2(q + 6), 8); /* Flags */
	assertEqualInt(i2(q + 8), 0); /* Compression method */
	assertEqualInt(i2(q + 10), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2(q + 12), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	assertEqualInt(i4(q + 14), 0); /* CRC-32 */
	assertEqualInt(i4(q + 18), sizeof(file_data1) + sizeof(file_data2)); /* Compressed size */
	assertEqualInt(i4(q + 22), sizeof(file_data1) + sizeof(file_data2)); /* Uncompressed size */
	assertEqualInt(i2(q + 26), strlen(file_name)); /* Pathname length */
	assertEqualInt(i2(q + 28), 41); /* Extra field length */
	assertEqualMem(q + 30, file_name, strlen(file_name)); /* Pathname */
	extra_start = q = q + 30 + strlen(file_name);
	assertEqualInt(i2(q), 0x5455); /* 'UT' extension header */
	assertEqualInt(i2(q + 2), 9); /* 'UT' size */
	assertEqualInt(q[4], 3); /* 'UT' flags */
	assertEqualInt(i4(q + 5), t); /* 'UT' mtime */
	assertEqualInt(i4(q + 9), t + 3); /* 'UT' atime */
	q = q + 4 + i2(q + 2);

	assertEqualInt(i2(q), 0x7875); /* 'ux' extension header */
	assertEqualInt(i2(q + 2), 11); /* 'ux' size */
	assertEqualInt(q[4], 1); /* 'ux' version */
	assertEqualInt(q[5], 4); /* 'ux' uid size */
	assertEqualInt(i4(q + 6), file_uid); /* 'Ux' UID */
	assertEqualInt(q[10], 4); /* 'ux' gid size */
	assertEqualInt(i4(q + 11), file_gid); /* 'Ux' GID */
	q = q + 4 + i2(q + 2);

	assertEqualInt(i2(q), 0x6c65); /* 'el' experimental extension header */
	assertEqualInt(i2(q + 2), 9); /* size */
	assertEqualInt(q[4], 7); /* Bitmap of fields included. */
	assertEqualInt(i2(q + 5) >> 8, 3); /* system & version made by */
	assertEqualInt(i2(q + 7), 0); /* internal file attributes */
	assertEqualInt(i4(q + 9) >> 16 & 01777, file_perm); /* external file attributes */
	q = q + 4 + i2(q + 2);

	assert(q == extra_start + i2(local_header + 28));
	q = extra_start + i2(local_header + 28);

	/* Verify data of file entry. */
	assertEqualMem(q, file_data1, sizeof(file_data1));
	assertEqualMem(q + sizeof(file_data1), file_data2, sizeof(file_data2));
	q = q + sizeof(file_data1) + sizeof(file_data2);

	/* Verify data descriptor of file entry. */
	assertEqualMem(q, "PK\007\010", 4); /* Signature */
	assertEqualInt(i4(q + 4), crc); /* CRC-32 */
	assertEqualInt(i4(q + 8), sizeof(file_data1) + sizeof(file_data2)); /* Compressed size */
	assertEqualInt(i4(q + 12), sizeof(file_data1) + sizeof(file_data2)); /* Uncompressed size */
	q = q + 16;

	/* Verify folder entry in central directory. */
	assertEqualMem(p, "PK\001\002", 4); /* Signature */
	assertEqualInt(i2(p + 4), 3 * 256 + 20); /* Version made by */
	assertEqualInt(i2(p + 6), 20); /* Version needed to extract */
	assertEqualInt(i2(p + 8), 0); /* Flags */
	assertEqualInt(i2(p + 10), 0); /* Compression method */
	assertEqualInt(i2(p + 12), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2(p + 14), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	crc = 0;
	assertEqualInt(i4(p + 16), crc); /* CRC-32 */
	assertEqualInt(i4(p + 20), 0); /* Compressed size */
	assertEqualInt(i4(p + 24), 0); /* Uncompressed size */
	assertEqualInt(i2(p + 28), strlen(folder_name)); /* Pathname length */
	assertEqualInt(i2(p + 30), 28); /* Extra field length */
	assertEqualInt(i2(p + 32), 0); /* File comment length */
	assertEqualInt(i2(p + 34), 0); /* Disk number start */
	assertEqualInt(i2(p + 36), 0); /* Internal file attrs */
	assertEqualInt(i4(p + 38) >> 16 & 01777, folder_perm); /* External file attrs */
	assertEqualInt(i4(p + 42), q - buff); /* Offset of local header */
	assertEqualMem(p + 46, folder_name, strlen(folder_name)); /* Pathname */
	p = p + 46 + strlen(folder_name);
	assertEqualInt(i2(p), 0x5455); /* 'UT' extension header */
	assertEqualInt(i2(p + 2), 9); /* 'UT' size */
	assertEqualInt(p[4], 5); /* 'UT' flags */
	assertEqualInt(i4(p + 5), t); /* 'UT' mtime */
	assertEqualInt(i4(p + 9), t + 5); /* 'UT' atime */
	p = p + 4 + i2(p + 2);
	assertEqualInt(i2(p), 0x7875); /* 'ux' extension header */
	assertEqualInt(i2(p + 2), 11); /* 'ux' size */
	assertEqualInt(p[4], 1); /* 'ux' version */
	assertEqualInt(p[5], 4); /* 'ux' uid size */
	assertEqualInt(i4(p + 6), folder_uid); /* 'ux' UID */
	assertEqualInt(p[10], 4); /* 'ux' gid size */
	assertEqualInt(i4(p + 11), folder_gid); /* 'ux' GID */
	/*p = p + 4 + i2(p + 2);*/

	/* Verify local header of folder entry. */
	local_header = q;
	assertEqualMem(q, "PK\003\004", 4); /* Signature */
	assertEqualInt(i2(q + 4), 20); /* Version needed to extract */
	assertEqualInt(i2(q + 6), 0); /* Flags */
	assertEqualInt(i2(q + 8), 0); /* Compression method */
	assertEqualInt(i2(q + 10), (tm->tm_hour * 2048) + (tm->tm_min * 32) + (tm->tm_sec / 2)); /* File time */
	assertEqualInt(i2(q + 12), ((tm->tm_year - 80) * 512) + ((tm->tm_mon + 1) * 32) + tm->tm_mday); /* File date */
	assertEqualInt(i4(q + 14), 0); /* CRC-32 */
	assertEqualInt(i4(q + 18), 0); /* Compressed size */
	assertEqualInt(i4(q + 22), 0); /* Uncompressed size */
	assertEqualInt(i2(q + 26), strlen(folder_name)); /* Pathname length */
	assertEqualInt(i2(q + 28), 41); /* Extra field length */
	assertEqualMem(q + 30, folder_name, strlen(folder_name)); /* Pathname */
	extra_start = q = q + 30 + strlen(folder_name);
	assertEqualInt(i2(q), 0x5455); /* 'UT' extension header */
	assertEqualInt(i2(q + 2), 9); /* 'UT' size */
	assertEqualInt(q[4], 5); /* 'UT' flags */
	assertEqualInt(i4(q + 5), t); /* 'UT' mtime */
	assertEqualInt(i4(q + 9), t + 5); /* 'UT' atime */
	q = q + 4 + i2(q + 2);
	assertEqualInt(i2(q), 0x7875); /* 'ux' extension header */
	assertEqualInt(i2(q + 2), 11); /* 'ux' size */
	assertEqualInt(q[4], 1); /* 'ux' version */
	assertEqualInt(q[5], 4); /* 'ux' uid size */
	assertEqualInt(i4(q + 6), folder_uid); /* 'ux' UID */
	assertEqualInt(q[10], 4); /* 'ux' gid size */
	assertEqualInt(i4(q + 11), folder_gid); /* 'ux' GID */
	q = q + 4 + i2(q + 2);

	assertEqualInt(i2(q), 0x6c65); /* 'el' experimental extension header */
	assertEqualInt(i2(q + 2), 9); /* size */
	assertEqualInt(q[4], 7); /* bitmap of fields */
	assertEqualInt(i2(q + 5) >> 8, 3); /* system & version made by */
	assertEqualInt(i2(q + 7), 0); /* internal file attributes */
	assertEqualInt(i4(q + 9) >> 16 & 01777, folder_perm); /* external file attributes */
	q = q + 4 + i2(q + 2);

	assert(q == extra_start + i2(local_header + 28));
	q = extra_start + i2(local_header + 28);

	/* There should not be any data in the folder entry,
	 * so the first central directory entry should be next: */
	assertEqualMem(q, "PK\001\002", 4); /* Signature */
}